

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

int fsetline(FILE *file,int linenumber)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  bool bVar3;
  char local_438 [8];
  char line [1024];
  char *r;
  int i;
  int cur;
  int linenumber_local;
  FILE *file_local;
  
  r._4_4_ = 0;
  if (linenumber < 1) {
    file_local._4_4_ = 1;
  }
  else {
    lVar1 = ftell((FILE *)file);
    rewind((FILE *)file);
    for (; r._4_4_ < linenumber + -1; r._4_4_ = r._4_4_ + 1) {
      do {
        __s = fgets(local_438,0x400,(FILE *)file);
        if (__s == (char *)0x0) {
          clearerr((FILE *)file);
          fseek((FILE *)file,(long)(int)lVar1,0);
          return 1;
        }
        sVar2 = strlen(__s);
        bVar3 = false;
        if (sVar2 == 0x3ff) {
          bVar3 = __s[0x3fe] != '\n';
        }
      } while (bVar3);
    }
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

inline int fsetline(FILE* file, int linenumber)
{ 
	int cur = 0, i = 0;
	char* r = NULL;
	char line[1024];

	if (linenumber <= 0) return EXIT_FAILURE;

	cur = ftell(file);
	rewind(file);

	while (i < linenumber-1)
	{
		do
		{
			r = fgets(line, sizeof(line), file);
			if (r == NULL) 
			{
				// If fgets() fails, try to go back to initial position.
				clearerr(file);
				fseek(file, cur, SEEK_SET);
				return EXIT_FAILURE;
			}
		} while ((strlen(r) == sizeof(line)-1)&&(r[sizeof(line)-2] != '\n'));
		i++;
	} 

	return EXIT_SUCCESS;
}